

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O1

bool isRemainingAllZero(Block *block,uint startIndex)

{
  ulong uVar1;
  ulong uVar2;
  uint j;
  
  if ((0x3f < startIndex) || (uVar1 = (ulong)startIndex, (*block)[""[startIndex]] != 0)) {
    return 0x3f < startIndex;
  }
  do {
    uVar2 = uVar1;
    if ((int)uVar2 == 0x3f) break;
    uVar1 = uVar2 + 1;
  } while ((*block)[""[uVar2 + 1]] == 0);
  return 0x3e < uVar2;
}

Assistant:

bool isRemainingAllZero(const Block& block, uint startIndex) {
    bool isAllZero = true; //judge if all other pixels that follow are zero
    for(uint j = startIndex; j < 64; j++) {
        if(block[ZIG_ZAG[j]] != 0) {
            isAllZero = false;
            break;
        }
    }
    return isAllZero;
}